

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O0

type jsoncons::jsonpointer::
     remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::__cxx11::string>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *root,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *location_str,
               error_code *ec)

{
  bool bVar1;
  error_code *in_RDX;
  string *in_RSI;
  basic_json_pointer<char> jsonptr;
  string_view_type *in_stack_00000058;
  error_code *in_stack_000000f0;
  basic_json_pointer<char> *in_stack_000000f8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000100;
  
  std::__cxx11::string::operator_cast_to_basic_string_view(in_RSI);
  basic_json_pointer<char>::parse(in_stack_00000058,(error_code *)root);
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (!bVar1) {
    remove<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
              (in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  }
  basic_json_pointer<char>::~basic_json_pointer((basic_json_pointer<char> *)0x721501);
  return;
}

Assistant:

typename std::enable_if<std::is_convertible<StringSource,jsoncons::basic_string_view<typename Json::char_type>>::value,void>::type
    remove(Json& root, const StringSource& location_str, std::error_code& ec)
    {
        auto jsonptr = basic_json_pointer<typename Json::char_type>::parse(location_str, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        remove(root, jsonptr, ec);
    }